

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ColladaExporter.cpp
# Opt level: O1

void __thiscall Assimp::ColladaExporter::WriteSpotLight(ColladaExporter *this,aiLight *light)

{
  undefined1 *puVar1;
  float fVar2;
  ostream *poVar3;
  double dVar4;
  
  puVar1 = &this->field_0x38;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<spot>",6);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  std::__cxx11::string::append((char *)&this->startstr);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<color sid=\"color\">",0x13);
  poVar3 = std::ostream::_M_insert<double>((double)(light->mColorDiffuse).r);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<double>((double)(light->mColorDiffuse).g);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3," ",1);
  poVar3 = std::ostream::_M_insert<double>((double)(light->mColorDiffuse).b);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</color>",8);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<constant_attenuation>",0x16);
  poVar3 = std::ostream::_M_insert<double>((double)light->mAttenuationConstant);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</constant_attenuation>",0x17);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<linear_attenuation>",0x14);
  poVar3 = std::ostream::_M_insert<double>((double)light->mAttenuationLinear);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</linear_attenuation>",0x15);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"<quadratic_attenuation>",0x17);
  poVar3 = std::ostream::_M_insert<double>((double)light->mAttenuationQuadratic);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</quadratic_attenuation>",0x18);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  fVar2 = light->mAngleInnerCone;
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"<falloff_angle sid=\"fall_off_angle\">",0x24);
  poVar3 = std::ostream::_M_insert<double>((double)(fVar2 * 57.29578));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</falloff_angle>",0x10);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  dVar4 = cos((double)(light->mAngleOuterCone - light->mAngleInnerCone));
  dVar4 = log(dVar4);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,"<falloff_exponent sid=\"fall_off_exponent\">",0x2a);
  poVar3 = std::ostream::_M_insert<double>(1.0 / (dVar4 / -2.3025850929940455));
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</falloff_exponent>",0x13);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  PopTag(this);
  poVar3 = std::__ostream_insert<char,std::char_traits<char>>
                     ((ostream *)puVar1,(this->startstr)._M_dataplus._M_p,
                      (this->startstr)._M_string_length);
  std::__ostream_insert<char,std::char_traits<char>>(poVar3,"</spot>",7);
  std::__ostream_insert<char,std::char_traits<char>>
            (poVar3,(this->endstr)._M_dataplus._M_p,(this->endstr)._M_string_length);
  return;
}

Assistant:

void ColladaExporter::WriteSpotLight(const aiLight *const light){

    const aiColor3D &color=  light->mColorDiffuse;
    mOutput << startstr << "<spot>" << endstr;
    PushTag();
    mOutput << startstr << "<color sid=\"color\">"
                            << color.r<<" "<<color.g<<" "<<color.b
                        <<"</color>" << endstr;
    mOutput << startstr << "<constant_attenuation>"
                                << light->mAttenuationConstant
                            <<"</constant_attenuation>" << endstr;
    mOutput << startstr << "<linear_attenuation>"
                            << light->mAttenuationLinear
                        <<"</linear_attenuation>" << endstr;
    mOutput << startstr << "<quadratic_attenuation>"
                            << light->mAttenuationQuadratic
                        <<"</quadratic_attenuation>" << endstr;
    /*
    out->mAngleOuterCone = AI_DEG_TO_RAD (std::acos(std::pow(0.1f,1.f/srcLight->mFalloffExponent))+
                            srcLight->mFalloffAngle);
    */

    const ai_real fallOffAngle = AI_RAD_TO_DEG(light->mAngleInnerCone);
    mOutput << startstr <<"<falloff_angle sid=\"fall_off_angle\">"
                                << fallOffAngle
                        <<"</falloff_angle>" << endstr;
    double temp = light->mAngleOuterCone-light->mAngleInnerCone;

    temp = std::cos(temp);
    temp = std::log(temp)/std::log(0.1);
    temp = 1/temp;
    mOutput << startstr << "<falloff_exponent sid=\"fall_off_exponent\">"
                            << temp
                        <<"</falloff_exponent>" << endstr;


    PopTag();
    mOutput << startstr << "</spot>" << endstr;

}